

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

PAL_ERROR PROCGetProcessStatus
                    (CPalThread *pThread,HANDLE hProcess,PROCESS_STATE *pps,DWORD *pdwExitCode)

{
  uint __pid;
  PAL_ERROR PVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  int *piVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  IPalObject *pobjProcess;
  IDataLock *pDataLock;
  uint *puStack_48;
  int status;
  CProcProcessLocalData *pLocalData;
  PROCESS_STATE *local_38;
  
  PVar1 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                    (CorUnix::g_pObjectManager,pThread,hProcess,&aotProcess,0);
  if (PVar1 != 0) {
    return PVar1;
  }
  PVar1 = (**(code **)(_DAT_00000000 + 0x18))(0,pThread,1,&pobjProcess,&stack0xffffffffffffffb8);
  if (puStack_48[1] == 3) {
    if (PAL_InitializeChakraCoreCalled != false) {
      *pps = PS_DONE;
      *pdwExitCode = puStack_48[2];
      pp_Var6 = pobjProcess->_vptr_IPalObject;
      uVar7 = 0;
LAB_0034f8fc:
      (**pp_Var6)(pobjProcess,pThread,uVar7);
      return PVar1;
    }
  }
  else {
    pLocalData = (CProcProcessLocalData *)pdwExitCode;
    if (PAL_InitializeChakraCoreCalled != false) {
      local_38 = pps;
LAB_0034f736:
      uVar2 = waitpid(*puStack_48,(int *)((long)&pDataLock + 4),1);
      __pid = *puStack_48;
      if (uVar2 == __pid) {
        if ((pDataLock._4_4_ & 0x7f) == 0) {
          *(uint *)pLocalData = pDataLock._4_4_ >> 8 & 0xff;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
        }
        else {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
          *(undefined4 *)pLocalData = 1;
        }
LAB_0034f8c2:
        *local_38 = PS_DONE;
LAB_0034f8c8:
        if (*local_38 == PS_DONE) {
          puStack_48[1] = 3;
          puStack_48[2] = *(uint *)pLocalData;
        }
        if (PAL_InitializeChakraCoreCalled != false) {
          pp_Var6 = pobjProcess->_vptr_IPalObject;
          uVar7 = 1;
          goto LAB_0034f8fc;
        }
        goto LAB_0034f77e;
      }
      if (uVar2 == 0xffffffff) {
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        if (iVar3 == 4) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
          goto LAB_0034f736;
        }
        if (iVar3 == 10) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
          iVar3 = kill(__pid,0);
          if (iVar3 == 0) goto LAB_0034f872;
          if (*piVar5 == 3) {
            uVar4 = 0;
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
            strerror(*piVar5);
            uVar4 = 1;
          }
          *(undefined4 *)pLocalData = uVar4;
          goto LAB_0034f8c2;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
        strerror(iVar3);
      }
      else {
        if (uVar2 != 0) {
          fprintf(_stderr,"] %s %s:%d","PROCGetProcessStatus",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x8ef);
          fprintf(_stderr,"waitpid returned unexpected value %d\n",(ulong)uVar2);
          *(undefined4 *)pLocalData = 1;
          goto LAB_0034f8c2;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034f77e;
      }
LAB_0034f872:
      *local_38 = PS_RUNNING;
      *(undefined4 *)pLocalData = 0;
      goto LAB_0034f8c8;
    }
  }
LAB_0034f77e:
  abort();
}

Assistant:

PAL_ERROR
PROCGetProcessStatus(
    CPalThread *pThread,
    HANDLE hProcess,
    PROCESS_STATE *pps,
    DWORD *pdwExitCode
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IDataLock *pDataLock;
    CProcProcessLocalData *pLocalData;
    pid_t wait_retval;
    int status;

    //
    // First, check if we already know the status of this process. This will be
    // the case if this function has already been called for the same process.
    //

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hProcess,
        &aotProcess,
        0,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        goto PROCGetProcessStatusExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (PS_DONE == pLocalData->ps)
    {
        TRACE("We already called waitpid() on process ID %#x; process has "
              "terminated, exit code is %d\n",
              pLocalData->dwProcessId, pLocalData->dwExitCode);

        *pps = pLocalData->ps;
        *pdwExitCode = pLocalData->dwExitCode;

        pDataLock->ReleaseLock(pThread, FALSE);

        goto PROCGetProcessStatusExit;
    }

    /* By using waitpid(), we can even retrieve the exit code of a non-PAL
       process. However, note that waitpid() can only provide the low 8 bits
       of the exit code. This is all that is required for the PAL spec. */
    TRACE("Looking for status of process; trying wait()");

    while(1)
    {
        /* try to get state of process, using non-blocking call */
        wait_retval = waitpid(pLocalData->dwProcessId, &status, WNOHANG);

        if ( wait_retval == (pid_t) pLocalData->dwProcessId )
        {
            /* success; get the exit code */
            if ( WIFEXITED( status ) )
            {
                *pdwExitCode = WEXITSTATUS(status);
                TRACE("Exit code was %d\n", *pdwExitCode);
            }
            else
            {
                WARN("process terminated without exiting; can't get exit "
                     "code. faking it.\n");
                *pdwExitCode = EXIT_FAILURE;
            }
            *pps = PS_DONE;
        }
        else if (0 == wait_retval)
        {
            // The process is still running.
            TRACE("Process %#x is still active.\n", pLocalData->dwProcessId);
            *pps = PS_RUNNING;
            *pdwExitCode = 0;
        }
        else if (-1 == wait_retval)
        {
            // This might happen if waitpid() had already been called, but
            // this shouldn't happen - we call waitpid once, store the
            // result, and use that afterwards.
            // One legitimate cause of failure is EINTR; if this happens we
            // have to try again. A second legitimate cause is ECHILD, which
            // happens if we're trying to retrieve the status of a currently-
            // running process that isn't a child of this process.
            if (EINTR == errno)
            {
                TRACE("waitpid() failed with EINTR; re-waiting");
                continue;
            }
            else if (ECHILD == errno)
            {
                TRACE("waitpid() failed with ECHILD; calling kill instead");
                if (kill(pLocalData->dwProcessId, 0) != 0)
                {
                    if(ESRCH == errno)
                    {
                        WARN("kill() failed with ESRCH, i.e. target "
                             "process exited and it wasn't a child, "
                             "so can't get the exit code, assuming  "
                             "it was 0.\n");
                        *pdwExitCode = 0;
                    }
                    else
                    {
                        ERROR("kill(pid, 0) failed; errno is %d (%s)\n",
                              errno, strerror(errno));
                        *pdwExitCode = EXIT_FAILURE;
                    }
                    *pps = PS_DONE;
                }
                else
                {
                    *pps = PS_RUNNING;
                    *pdwExitCode = 0;
                }
            }
            else
            {
                // Ignoring unexpected waitpid errno and assuming that
                // the process is still running
                ERROR("waitpid(pid=%u) failed with unexpected errno=%d (%s)\n",
                      pLocalData->dwProcessId, errno, strerror(errno));
                *pps = PS_RUNNING;
                *pdwExitCode = 0;
            }
        }
        else
        {
            ASSERT("waitpid returned unexpected value %d\n",wait_retval);
            *pdwExitCode = EXIT_FAILURE;
            *pps = PS_DONE;
        }
        // Break out of the loop in all cases except EINTR.
        break;
    }

    // Save the exit code for future reference (waitpid will only work once).
    if(PS_DONE == *pps)
    {
        pLocalData->ps = PS_DONE;
        pLocalData->dwExitCode = *pdwExitCode;
    }

    TRACE( "State of process 0x%08x : %d (exit code %d)\n",
           pLocalData->dwProcessId, *pps, *pdwExitCode );

    pDataLock->ReleaseLock(pThread, TRUE);

PROCGetProcessStatusExit:

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    return palError;
}